

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::
shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
          (Random *this,
          __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          first,__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                last)

{
  unsigned_short uVar1;
  int iVar2;
  int max;
  ulong uVar3;
  
  uVar3 = (ulong)((long)last._M_current - (long)first._M_current) >> 1 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    max = (int)uVar3;
    if (max < 1) break;
    iVar2 = getInt(this,0,max);
    uVar1 = *(first._M_current + (ulong)(uint)(max * 2));
    *(first._M_current + (ulong)(uint)(max * 2)) = first._M_current[iVar2];
    first._M_current[iVar2] = uVar1;
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}